

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjCollectInternalCut_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  iVar1 = Gia_ObjHasNumId(p,iObj);
  if (iVar1 != 0) {
    return;
  }
  pGVar2 = Gia_ManObj(p,iObj);
  if ((-1 < (int)(uint)*(undefined8 *)pGVar2) &&
     (((uint)*(undefined8 *)pGVar2 & 0x1fffffff) != 0x1fffffff)) {
    pGVar2 = Gia_ManObj(p,iObj);
    Gia_ObjCollectInternalCut_rec(p,iObj - (*(uint *)pGVar2 & 0x1fffffff));
    pGVar2 = Gia_ManObj(p,iObj);
    Gia_ObjCollectInternalCut_rec(p,iObj - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff));
    Gia_ObjSetNumId(p,iObj,p->vTtNodes->nSize);
    Vec_IntPush(p->vTtNodes,iObj);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iObj))",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                ,0x16c,"void Gia_ObjCollectInternalCut_rec(Gia_Man_t *, int)");
}

Assistant:

void Gia_ObjCollectInternalCut_rec( Gia_Man_t * p, int iObj )
{
    if ( Gia_ObjHasNumId(p, iObj) )
        return;
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iObj)) );
    Gia_ObjCollectInternalCut_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iObj), iObj) );
    Gia_ObjCollectInternalCut_rec( p, Gia_ObjFaninId1(Gia_ManObj(p, iObj), iObj) );
    Gia_ObjSetNumId( p, iObj, Vec_IntSize(p->vTtNodes) );
    Vec_IntPush( p->vTtNodes, iObj );
}